

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

void js_async_from_sync_iterator_mark(JSRuntime *rt,JSValue val,JS_MarkFunc *mark_func)

{
  undefined8 *puVar1;
  
  if ((((int)val.tag == -1) && (*(short *)((long)val.u.ptr + 6) == 0x30)) &&
     (puVar1 = *(undefined8 **)((long)val.u.ptr + 0x30), puVar1 != (undefined8 *)0x0)) {
    if ((*(uint *)(puVar1 + 1) & 0xfffffffe) == 0xfffffffe) {
      (*mark_func)(rt,(JSGCObjectHeader *)*puVar1);
    }
    if ((*(uint *)(puVar1 + 3) & 0xfffffffe) == 0xfffffffe) {
      (*mark_func)(rt,(JSGCObjectHeader *)puVar1[2]);
      return;
    }
  }
  return;
}

Assistant:

static void js_async_from_sync_iterator_mark(JSRuntime *rt, JSValueConst val,
                                             JS_MarkFunc *mark_func)
{
    JSAsyncFromSyncIteratorData *s =
        JS_GetOpaque(val, JS_CLASS_ASYNC_FROM_SYNC_ITERATOR);
    if (s) {
        JS_MarkValue(rt, s->sync_iter, mark_func);
        JS_MarkValue(rt, s->next_method, mark_func);
    }
}